

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Erase(ShardedLRUCache *this,Slice *key)

{
  uint32_t *puVar1;
  LRUHandle *e;
  uint32_t hash;
  uint uVar2;
  int iVar3;
  LRUHandle **ppLVar4;
  Mutex *__mutex;
  
  hash = Hash(key->data_,key->size_,0);
  uVar2 = hash >> 0x1c;
  __mutex = &this->shard_[uVar2].mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    ppLVar4 = HandleTable::FindPointer(&this->shard_[uVar2].table_,key,hash);
    e = *ppLVar4;
    if (e != (LRUHandle *)0x0) {
      *ppLVar4 = e->next_hash;
      puVar1 = &this->shard_[uVar2].table_.elems_;
      *puVar1 = *puVar1 - 1;
    }
    LRUCache::FinishErase(this->shard_ + uVar2,e);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void Erase(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    shard_[Shard(hash)].Erase(key, hash);
  }